

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O0

void ihevc_inter_pred_chroma_horz
               (UWORD8 *pu1_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  UWORD8 UVar1;
  UWORD8 UVar2;
  short sVar3;
  WORD16 i2_tmp_v;
  WORD16 i2_tmp_u;
  WORD32 i;
  WORD32 col;
  WORD32 row;
  WORD32 ht_local;
  WORD8 *pi1_coeff_local;
  WORD32 dst_strd_local;
  WORD32 src_strd_local;
  UWORD8 *pu1_dst_local;
  UWORD8 *pu1_src_local;
  
  pu1_dst_local = pu1_dst;
  pu1_src_local = pu1_src;
  for (row = 0; row < ht; row = row + 1) {
    for (col = 0; SBORROW4(col,wd * 2) != col + wd * -2 < 0; col = col + 2) {
      i2_tmp_u = 0;
      i2_tmp_v = 0;
      for (i = 0; i < 4; i = i + 1) {
        i2_tmp_u = i2_tmp_u + (short)pi1_coeff[i] * (ushort)pu1_src_local[col + (i + -1) * 2];
        i2_tmp_v = i2_tmp_v + (short)pi1_coeff[i] * (ushort)pu1_src_local[col + 1 + (i + -1) * 2];
      }
      sVar3 = (short)(i2_tmp_u + 0x20 >> 6);
      if (sVar3 < 0x100) {
        if (sVar3 < 0) {
          sVar3 = 0;
        }
        UVar1 = (UWORD8)sVar3;
      }
      else {
        UVar1 = 0xff;
      }
      sVar3 = (short)(i2_tmp_v + 0x20 >> 6);
      if (sVar3 < 0x100) {
        if (sVar3 < 0) {
          sVar3 = 0;
        }
        UVar2 = (UWORD8)sVar3;
      }
      else {
        UVar2 = 0xff;
      }
      pu1_dst_local[col] = UVar1;
      pu1_dst_local[col + 1] = UVar2;
    }
    pu1_src_local = pu1_src_local + src_strd;
    pu1_dst_local = pu1_dst_local + dst_strd;
  }
  return;
}

Assistant:

void ihevc_inter_pred_chroma_horz(UWORD8 *pu1_src,
                                  UWORD8 *pu1_dst,
                                  WORD32 src_strd,
                                  WORD32 dst_strd,
                                  WORD8 *pi1_coeff,
                                  WORD32 ht,
                                  WORD32 wd)
{
    WORD32 row, col, i;
    WORD16 i2_tmp_u, i2_tmp_v;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < 2 * wd; col += 2)
        {
            i2_tmp_u = 0;
            i2_tmp_v = 0;
            for(i = 0; i < NTAPS_CHROMA; i++)
            {
                i2_tmp_u += pi1_coeff[i] * pu1_src[col + (i - 1) * 2];
                i2_tmp_v += pi1_coeff[i] * pu1_src[col + 1 + (i - 1) * 2];
            }

            i2_tmp_u = (i2_tmp_u + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH;
            i2_tmp_u = CLIP_U8(i2_tmp_u);
            i2_tmp_v = (i2_tmp_v + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH;
            i2_tmp_v = CLIP_U8(i2_tmp_v);


            pu1_dst[col] = (UWORD8)i2_tmp_u;
            pu1_dst[col + 1] = (UWORD8)i2_tmp_v;
        }

        pu1_src += src_strd;
        pu1_dst += dst_strd;
    }
}